

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTest.cpp
# Opt level: O0

void __thiscall Interpreter::Interpreter(Interpreter *this,Interpreter *param_1)

{
  Interpreter *param_1_local;
  Interpreter *this_local;
  
  List<int>::List(&this->l,&param_1->l);
  return;
}

Assistant:

List<A> operator()(Prog<A> prog) {
    struct Visitor {
      List<int>& l;
      List<A> operator()(const Read<A>& r) {
        // invoke the continuation with each of the values that have been written so far
        return Functor::fmap(r.next, l);
      }
      List<A> operator()(const Write<A>& w) {
        // remember the value and invoke the continuation
        l.push_back(w.x);
        return {w.next(unit{})};
      }
    };
    Visitor v{l};
    return boost::apply_visitor(v, prog.v);
  }